

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O0

string * __thiscall SequenceDistanceGraphPath::sequence_abi_cxx11_(SequenceDistanceGraphPath *this)

{
  sgNodeID_t sVar1;
  sgNodeID_t sVar2;
  bool bVar3;
  ostream *poVar4;
  const_reference pvVar5;
  void *this_00;
  pointer pLVar6;
  long lVar7;
  long lVar8;
  runtime_error *prVar9;
  reference plVar10;
  long in_RSI;
  string *in_RDI;
  long *n_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<long,_std::allocator<long>_> *__range2_1;
  char buffer [250];
  char *s2;
  char *s1;
  int32_t ovl;
  int32_t c;
  const_iterator l;
  value_type rcn;
  string nseq;
  long *n_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  sgNodeID_t pnode;
  long *n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  string *s;
  Node *in_stack_fffffffffffffd28;
  Node *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd58;
  char *__s;
  size_type local_268;
  size_type local_258;
  Node *in_stack_fffffffffffffdb0;
  size_type local_248;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_208 [2];
  char local_1f8 [256];
  char *local_f8;
  char *local_f0;
  int local_e8;
  int local_e4;
  Link *local_e0;
  Link *local_d8;
  __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_d0;
  string local_c8 [56];
  string local_90 [32];
  size_type *local_70;
  long *local_68;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_60 [2];
  size_type local_50;
  allocator local_32;
  undefined1 local_31;
  long *local_30;
  long *local_28;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_20 [4];
  
  poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  std::operator<<(poVar4,"sequence for a SequenceDistanceGraphPath with nodes = [");
  if (sdglib::OutputLogLevel == 2) {
    local_20[0]._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::begin
                           ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd28);
    local_28 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd28);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffd30,
                              (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffd28), bVar3) {
      local_30 = __gnu_cxx::
                 __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator*(local_20);
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::operator<<(poVar4,*local_30);
      __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
      operator++(local_20);
    }
    poVar4 = std::operator<<((ostream *)&std::cout," ]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_31 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  local_50 = 0;
  local_60[0]._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd28);
  local_68 = (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd28);
  do {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *
                       )in_stack_fffffffffffffd30,
                       (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *
                       )in_stack_fffffffffffffd28);
    if (!bVar3) {
      poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
      std::operator<<(poVar4,
                      "sequence finished successfully for SequenceDistanceGraphPath with nodes = [")
      ;
      if (sdglib::OutputLogLevel == 2) {
        local_208[0]._M_current =
             (long *)std::vector<long,_std::allocator<long>_>::begin
                               ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd28);
        std::vector<long,_std::allocator<long>_>::end
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd28);
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffd30,
                                  (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffd28), bVar3) {
          plVar10 = __gnu_cxx::
                    __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                    operator*(local_208);
          in_stack_fffffffffffffd30 = (Node *)std::operator<<((ostream *)&std::cout," ");
          std::ostream::operator<<(in_stack_fffffffffffffd30,*plVar10);
          __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator++(local_208);
        }
        poVar4 = std::operator<<((ostream *)&std::cout," ]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      return in_RDI;
    }
    local_70 = (size_type *)
               __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
               ::operator*(local_60);
    std::__cxx11::string::string(local_90);
    if ((long)*local_70 < 1) {
      std::vector<Node,_std::allocator<Node>_>::operator[]
                ((vector<Node,_std::allocator<Node>_> *)(*(long *)(in_RSI + 0x18) + 0x40),-*local_70
                );
      Node::Node(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      Node::make_rc(in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator=(local_90,local_c8);
      Node::~Node((Node *)0x38a433);
    }
    else {
      pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                         ((vector<Node,_std::allocator<Node>_> *)(*(long *)(in_RSI + 0x18) + 0x40),
                          *local_70);
      std::__cxx11::string::operator=(local_90,(string *)pvVar5);
    }
    if (local_50 != 0) {
      if ((long)local_50 < 1) {
        local_248 = -local_50;
      }
      else {
        local_248 = local_50;
      }
      std::
      vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
      ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    *)(*(long *)(in_RSI + 0x18) + 8),local_248);
      local_d0._M_current =
           (Link *)std::vector<Link,_std::allocator<Link>_>::begin
                             ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffd28);
      while( true ) {
        in_stack_fffffffffffffdb0 = (Node *)(*(long *)(in_RSI + 0x18) + 8);
        if ((long)local_50 < 1) {
          local_258 = -local_50;
        }
        else {
          local_258 = local_50;
        }
        std::
        vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
        ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                      *)in_stack_fffffffffffffdb0,local_258);
        local_d8 = (Link *)std::vector<Link,_std::allocator<Link>_>::end
                                     ((vector<Link,_std::allocator<Link>_> *)
                                      in_stack_fffffffffffffd28);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                            *)in_stack_fffffffffffffd30,
                           (__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                            *)in_stack_fffffffffffffd28);
        if ((!bVar3) ||
           ((pLVar6 = __gnu_cxx::
                      __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                      operator->(&local_d0), pLVar6->source == local_50 &&
            (pLVar6 = __gnu_cxx::
                      __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                      operator->(&local_d0), pLVar6->dest == *local_70)))) break;
        __gnu_cxx::__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
        operator++(&local_d0);
      }
      if ((long)local_50 < 1) {
        local_268 = -local_50;
      }
      else {
        local_268 = local_50;
      }
      std::
      vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
      ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    *)(*(long *)(in_RSI + 0x18) + 8),local_268);
      local_e0 = (Link *)std::vector<Link,_std::allocator<Link>_>::end
                                   ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffd28
                                   );
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                          *)in_stack_fffffffffffffd30,
                         (__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                          *)in_stack_fffffffffffffd28);
      if (bVar3) {
        poVar4 = std::operator<<((ostream *)&std::cout,"can\'t find a link between ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_50);
        poVar4 = std::operator<<(poVar4," and ");
        this_00 = (void *)std::ostream::operator<<(poVar4,*local_70);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"path has no link");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pLVar6 = __gnu_cxx::__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
               ::operator->(&local_d0);
      if (pLVar6->dist < 1) {
        pLVar6 = __gnu_cxx::
                 __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                 operator->(&local_d0);
        local_e8 = -pLVar6->dist;
        lVar7 = std::__cxx11::string::c_str();
        lVar8 = std::__cxx11::string::size();
        local_f0 = (char *)((lVar7 + lVar8) - (long)local_e8);
        local_f8 = (char *)std::__cxx11::string::c_str();
        for (; *local_f0 != '\0'; local_f0 = local_f0 + 1) {
          if (*local_f0 != *local_f8) {
            pLVar6 = __gnu_cxx::
                     __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                     operator->(&local_d0);
            sVar1 = pLVar6->source;
            pLVar6 = __gnu_cxx::
                     __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                     operator->(&local_d0);
            sVar2 = pLVar6->dest;
            pLVar6 = __gnu_cxx::
                     __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                     operator->(&local_d0);
            __s = local_1f8;
            sprintf(__s,"path overlap is invalid! (%d,%d,%d)",sVar1,sVar2,(ulong)(uint)pLVar6->dist)
            ;
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,__s);
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_f8 = local_f8 + 1;
        }
        std::__cxx11::string::erase((ulong)local_90,0);
      }
      else {
        pLVar6 = __gnu_cxx::
                 __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                 operator->(&local_d0);
        for (local_e4 = pLVar6->dist; 0 < local_e4; local_e4 = local_e4 + -1) {
          std::__cxx11::string::operator+=((string *)in_RDI,"N");
        }
      }
    }
    std::__cxx11::string::operator+=((string *)in_RDI,local_90);
    local_50 = -*local_70;
    std::__cxx11::string::~string(local_90);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(local_60);
  } while( true );
}

Assistant:

std::string SequenceDistanceGraphPath::sequence() const {
    sdglib::OutputLog(sdglib::LogLevels::DEBUG) << "sequence for a SequenceDistanceGraphPath with nodes = [" ;
    if(sdglib::OutputLogLevel == sdglib::LogLevels::DEBUG) {
        for(auto &n:nodes) std::cout << " " << n;
        std::cout << " ]" << std::endl;
    }
    std::string s = "";
    sgNodeID_t pnode = 0;
    // just iterate over every node in path - contig names are converted to ids at construction
    for (auto &n:nodes) {
        std::string nseq;
        if (n>0){
            nseq = sg.nodes[n].sequence;
        } else {
            auto rcn = sg.nodes[-n];
            rcn.make_rc();
            nseq = rcn.sequence;
        }
        if (pnode !=0){
            //find link between pnode' output (+pnode) and n's sink (-n)
            auto l=sg.links[(pnode>0 ? pnode:-pnode)].begin();
            for (;l!=sg.links[(pnode>0 ? pnode:-pnode)].end();++l)
                if (l->source==pnode and l->dest==n) break;
            if (l==sg.links[(pnode>0 ? pnode:-pnode)].end()) {
                std::cout<<"can't find a link between "<<pnode<<" and "<<n<<std::endl;
                throw std::runtime_error("path has no link");
            } else {
                if (l->dist > 0){
                    for (auto c = l->dist; c > 0; --c) s += "N";
                }
                else {
                    auto ovl =- l->dist;
                    for (auto s1 = s.c_str() + s.size() - ovl, s2 = nseq.c_str(); *s1 != NULL; ++s1, ++s2)
                        if (*s1 != *s2) {
                            char buffer[250];
                            sprintf(buffer,"path overlap is invalid! (%d,%d,%d)",l->source,l->dest,l->dist);
                            throw std::runtime_error(buffer);
                        }
                    nseq.erase(0, ovl);
                }
            }
        }
        s+=nseq;
        pnode=-n;
    }
    sdglib::OutputLog(sdglib::LogLevels::DEBUG) << "sequence finished successfully for SequenceDistanceGraphPath with nodes = [" ;
    if(sdglib::OutputLogLevel == sdglib::LogLevels::DEBUG) {
        for(auto &n:nodes) std::cout<<" "<<n;
        std::cout<<" ]"<<std::endl;
    }
    return s;
}